

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O1

void solveTSPRoute(Graph<std::pair<double,_double>_> *graph,UI *ui,int *start_node,int *end_node,
                  vector<int,_std::allocator<int>_> *POIs)

{
  double dVar1;
  pointer piVar2;
  pointer piVar3;
  ostream *poVar4;
  undefined8 uVar5;
  bool cancel;
  vector<int,_std::allocator<int>_> ord;
  Path path;
  function<Path_()> tsp_algorithm;
  Menu showMenu;
  Menu algorithmSelector;
  char local_369;
  void *local_368;
  undefined8 uStack_360;
  long local_358;
  Path local_348;
  undefined8 local_328;
  undefined8 uStack_320;
  code *local_318;
  code *pcStack_310;
  Menu local_300;
  UI *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  Menu local_d8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328 = 0;
  uStack_320 = 0;
  local_2c0 = ui;
  Path::Path(&local_348);
  local_368 = (void *)0x0;
  uStack_360 = 0;
  local_358 = 0;
  local_369 = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Select algorithm","");
  Menu::Menu(&local_d8,&local_f8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Cancel","");
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = &local_369;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:77:43)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:77:43)>
             ::_M_manager;
  Menu::addOption(&local_d8,&local_118,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Nearest-neighbor","");
  local_228 = (code *)0x0;
  pcStack_220 = (code *)0x0;
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_238._M_unused._M_object = operator_new(0x38);
  *(undefined8 **)local_238._M_unused._0_8_ = &local_328;
  *(Graph<std::pair<double,_double>_> **)((long)local_238._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_238._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_238._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_238._M_unused._0_8_ + 0x20) = POIs;
  *(void ***)((long)local_238._M_unused._0_8_ + 0x28) = &local_368;
  *(Path **)((long)local_238._M_unused._0_8_ + 0x30) = &local_348;
  pcStack_220 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:78:53)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:78:53)>
              ::_M_manager;
  Menu::addOption(&local_d8,&local_138,(function<void_()> *)&local_238);
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Nearest-neighbor 2-opt","");
  local_248 = (code *)0x0;
  pcStack_240 = (code *)0x0;
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_258._M_unused._M_object = operator_new(0x38);
  *(undefined8 **)local_258._M_unused._0_8_ = &local_328;
  *(Graph<std::pair<double,_double>_> **)((long)local_258._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_258._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_258._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_258._M_unused._0_8_ + 0x20) = POIs;
  *(void ***)((long)local_258._M_unused._0_8_ + 0x28) = &local_368;
  *(Path **)((long)local_258._M_unused._0_8_ + 0x30) = &local_348;
  pcStack_240 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:79:59)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:79:59)>
              ::_M_manager;
  Menu::addOption(&local_d8,&local_158,(function<void_()> *)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Randomized NN","");
  local_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_278._M_unused._M_object = operator_new(0x38);
  *(undefined8 **)local_278._M_unused._0_8_ = &local_328;
  *(Graph<std::pair<double,_double>_> **)((long)local_278._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_278._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_278._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_278._M_unused._0_8_ + 0x20) = POIs;
  *(void ***)((long)local_278._M_unused._0_8_ + 0x28) = &local_368;
  *(Path **)((long)local_278._M_unused._0_8_ + 0x30) = &local_348;
  pcStack_260 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:80:50)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:80:50)>
              ::_M_manager;
  Menu::addOption(&local_d8,&local_178,(function<void_()> *)&local_278);
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Randomized NN 2-opt","");
  local_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_298._M_unused._M_object = operator_new(0x38);
  *(undefined8 **)local_298._M_unused._0_8_ = &local_328;
  *(Graph<std::pair<double,_double>_> **)((long)local_298._M_unused._0_8_ + 8) = graph;
  *(int **)((long)local_298._M_unused._0_8_ + 0x10) = start_node;
  *(int **)((long)local_298._M_unused._0_8_ + 0x18) = end_node;
  *(vector<int,_std::allocator<int>_> **)((long)local_298._M_unused._0_8_ + 0x20) = POIs;
  *(void ***)((long)local_298._M_unused._0_8_ + 0x28) = &local_368;
  *(Path **)((long)local_298._M_unused._0_8_ + 0x30) = &local_348;
  pcStack_280 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:81:56)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:81:56)>
              ::_M_manager;
  Menu::addOption(&local_d8,&local_198,(function<void_()> *)&local_298);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  Menu::start(&local_d8);
  if (local_369 == '\0') {
    std::chrono::_V2::system_clock::now();
    if (local_318 == (code *)0x0) {
      uVar5 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar5);
    }
    (*pcStack_310)(&local_300);
    piVar3 = local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    piVar2 = local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_348.length = (double)local_300.name._M_dataplus._M_p;
    local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_300.name._M_string_length;
    local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_300.name.field_2._M_allocated_capacity;
    local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_300.name.field_2._8_8_;
    local_300.name._M_string_length = 0;
    local_300.name.field_2._M_allocated_capacity = 0;
    local_300.name.field_2._8_8_ = (pointer)0x0;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)piVar3 - (long)piVar2);
    }
    if ((pointer)local_300.name._M_string_length != (pointer)0x0) {
      operator_delete((void *)local_300.name._M_string_length,
                      local_300.name.field_2._8_8_ - local_300.name._M_string_length);
    }
    std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size: ",6);
    dVar1 = Path::getLength(&local_348);
    poVar4 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Time to pathfind (micro): ",0x1a);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Show path?","");
    Menu::Menu(&local_300,&local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"No","");
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:94:30)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:94:30)>
               ::_M_manager;
    Menu::addOption(&local_300,&local_1d8,(function<void_()> *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Yes, in GraphViewer","");
    local_2a8 = (code *)0x0;
    pcStack_2a0 = (code *)0x0;
    local_2b8._M_unused._M_object = (void *)0x0;
    local_2b8._8_8_ = 0;
    local_2b8._M_unused._M_object = operator_new(0x18);
    *(UI **)local_2b8._M_unused._0_8_ = local_2c0;
    *(Path **)((long)local_2b8._M_unused._0_8_ + 8) = &local_348;
    *(void ***)((long)local_2b8._M_unused._0_8_ + 0x10) = &local_368;
    pcStack_2a0 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:95:47)>
                  ::_M_invoke;
    local_2a8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:95:47)>
                ::_M_manager;
    Menu::addOption(&local_300,&local_1f8,(function<void_()> *)&local_2b8);
    if (local_2a8 != (code *)0x0) {
      (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Yes, in console","");
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = &local_368;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:96:43)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/MenuUtils.cpp:96:43)>
               ::_M_manager;
    Menu::addOption(&local_300,&local_218,(function<void_()> *)&local_98);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    Menu::start(&local_300);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
    ::~vector(&local_300.options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.name._M_dataplus._M_p != &local_300.name.field_2) {
      operator_delete(local_300.name._M_dataplus._M_p,
                      local_300.name.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::~vector(&local_d8.options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
    operator_delete(local_d8.name._M_dataplus._M_p,local_d8.name.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != (void *)0x0) {
    operator_delete(local_368,local_358 - (long)local_368);
  }
  if (local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  return;
}

Assistant:

void solveTSPRoute(Graph<coordinates> &graph, UI &ui, const int &start_node, const int &end_node, vector<int> &POIs) {
    function<Path ()> tsp_algorithm;
    Path path;
    vector<int> ord;
    bool cancel = false;

    Menu algorithmSelector("Select algorithm", false);
    algorithmSelector.addOption("Cancel", [&](){ cancel = true; });
    algorithmSelector.addOption("Nearest-neighbor", [&](){ tsp_algorithm = [&](){ return graph.nearestNeighborsSearch(start_node, end_node, POIs, ord, path); }; });
    algorithmSelector.addOption("Nearest-neighbor 2-opt", [&](){ tsp_algorithm = [&](){ graph.nearestNeighborsSearch(start_node, end_node, POIs, ord, path); return graph.twoOpt(ord, path); }; });
    algorithmSelector.addOption("Randomized NN", [&](){ tsp_algorithm = [&](){ return graph.RNNeighborsSearch(start_node, end_node, POIs, ord, path, 3); }; });
    algorithmSelector.addOption("Randomized NN 2-opt", [&](){ tsp_algorithm = [&](){ graph.RNNeighborsSearch(start_node, end_node, POIs, ord, path, 3); return graph.twoOpt(ord, path); }; });
    algorithmSelector.start();
    if (cancel) { return; }

    auto start = high_resolution_clock::now();
    path = tsp_algorithm();
    auto stop = high_resolution_clock::now();
    auto duration = duration_cast<microseconds>(stop - start);

    cout << "Size: " << path.getLength() << endl;
    cout << "Time to pathfind (micro): " << duration.count() << endl;

    Menu showMenu("Show path?", false);
    showMenu.addOption("No", EXIT);
    showMenu.addOption("Yes, in GraphViewer", [&](){ ui.showDeliveryPath(path.getPath(), ord); });
    showMenu.addOption("Yes, in console", [&](){ printPath(ord); enterWait(); });
    showMenu.start();
}